

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::operator==
          (Entity_Damage_Status_PDU *this,Entity_Damage_Status_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  StandardVariable *pSVar3;
  pointer pKVar4;
  KBOOL KVar5;
  pointer pKVar6;
  StandardVariable **ppSVar7;
  
  KVar5 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((!KVar5) &&
      (KVar5 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_DmgEnt,&Value->m_DmgEnt), !KVar5))
     && (this->m_ui16NumDmgDescRecs == Value->m_ui16NumDmgDescRecs)) {
    pKVar1 = (this->m_vDdRec).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vDdRec).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar6 = (Value->m_vDdRec).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vDdRec).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar6) {
      if (pKVar1 == pKVar2) {
        return pKVar1 == pKVar2;
      }
      if (pKVar1->m_pRef == pKVar6->m_pRef) {
        ppSVar7 = &pKVar6[1].m_pRef;
        do {
          pKVar6 = pKVar1 + 1;
          if (pKVar6 == pKVar2) {
            return pKVar6 == pKVar2;
          }
          pKVar4 = pKVar1 + 1;
          pSVar3 = *ppSVar7;
          ppSVar7 = ppSVar7 + 3;
          pKVar1 = pKVar6;
        } while (pKVar4->m_pRef == pSVar3);
        return false;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Entity_Damage_Status_PDU::operator == ( const Entity_Damage_Status_PDU & Value ) const
{
    if( Header::operator     !=( Value ) )                   return false;
    if( m_DmgEnt             != Value.m_DmgEnt )             return false;
    if( m_ui16NumDmgDescRecs != Value.m_ui16NumDmgDescRecs ) return false;
    if( m_vDdRec             != Value.m_vDdRec )             return false;
    return true;
}